

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

optional<real_token> *
read_real(optional<real_token> *__return_storage_ptr__,string_view buf_1,string_view buf_2)

{
  undefined1 auVar1 [16];
  byte bVar2;
  uint uVar3;
  double dVar4;
  undefined1 auVar5 [16];
  _Storage<double,_true> _Var6;
  undefined8 extraout_XMM0_Qb;
  optional<double> oVar7;
  
  if (buf_1._M_len == 1) {
    if (*buf_1._M_str == '-') {
      oVar7 = read_real(buf_2);
      if (((undefined1  [16])
           oVar7.super__Optional_base<double,_true,_true>._M_payload.
           super__Optional_payload_base<double> & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        dVar4 = -1.0;
        uVar3 = 1;
      }
      else {
        auVar5._8_8_ = 0x8000000000000000;
        auVar5._0_8_ = 0x8000000000000000;
        auVar1._8_8_ = extraout_XMM0_Qb;
        auVar1._0_8_ = oVar7.super__Optional_base<double,_true,_true>._M_payload.
                       super__Optional_payload_base<double>._M_payload;
        auVar5 = vxorpd_avx512vl(auVar1,auVar5);
        dVar4 = auVar5._0_8_;
        uVar3 = 2;
      }
      goto LAB_00139e21;
    }
    if (*buf_1._M_str != '+') goto LAB_00139dff;
    oVar7 = read_real(buf_2);
    _Var6 = oVar7.super__Optional_base<double,_true,_true>._M_payload.
            super__Optional_payload_base<double>._M_payload;
    bVar2 = oVar7.super__Optional_base<double,_true,_true>._M_payload.
            super__Optional_payload_base<double>._M_engaged;
    uVar3 = (bVar2 & 1) + 1;
  }
  else {
LAB_00139dff:
    oVar7 = read_real(buf_1);
    _Var6 = oVar7.super__Optional_base<double,_true,_true>._M_payload.
            super__Optional_payload_base<double>._M_payload;
    bVar2 = oVar7.super__Optional_base<double,_true,_true>._M_payload.
            super__Optional_payload_base<double>._M_engaged & 1;
    uVar3 = (uint)bVar2;
  }
  dVar4 = (double)((ulong)(bVar2 & 1) * (long)_Var6 + (ulong)!(bool)(bVar2 & 1) * 0x3ff0000000000000
                  );
LAB_00139e21:
  (__return_storage_ptr__->super__Optional_base<real_token,_true,_true>)._M_payload.
  super__Optional_payload_base<real_token>._M_payload._M_value.value = dVar4;
  (__return_storage_ptr__->super__Optional_base<real_token,_true,_true>)._M_payload.
  super__Optional_payload_base<real_token>._M_payload._M_value.read = uVar3;
  (__return_storage_ptr__->super__Optional_base<real_token,_true,_true>)._M_payload.
  super__Optional_payload_base<real_token>._M_engaged = true;
  return __return_storage_ptr__;
}

Assistant:

std::optional<real_token>
read_real(const std::string_view buf_1, const std::string_view buf_2) noexcept
{
    std::optional<double> value_opt;

    if (buf_1 == "-") {
        value_opt = read_real(buf_2);
        if (!value_opt)
            return real_token(-1.0, 1);
        else
            return real_token(-1.0 * *value_opt, 2);
    }

    if (buf_1 == "+") {
        value_opt = read_real(buf_2);
        if (!value_opt)
            return real_token(1.0, 1);
        else
            return real_token(*value_opt, 2);
    }

    value_opt = read_real(buf_1);
    if (!value_opt)
        return real_token(1.0, 0);

    return real_token(*value_opt, 1);
}